

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PSound::ReadValue(PSound *this,FSerializer *ar,char *key,void *addr)

{
  FSoundID local_3c;
  char *local_38;
  char *cptr;
  void *addr_local;
  char *key_local;
  FSerializer *ar_local;
  PSound *this_local;
  
  cptr = (char *)addr;
  addr_local = key;
  key_local = (char *)ar;
  ar_local = (FSerializer *)this;
  FSerializer::StringPtr(ar,key,&local_38);
  if (local_38 != (char *)0x0) {
    FSoundID::FSoundID(&local_3c,local_38);
    FSoundID::operator=((FSoundID *)cptr,&local_3c);
  }
  return local_38 != (char *)0x0;
}

Assistant:

bool PSound::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	const char *cptr;
	ar.StringPtr(key, cptr);
	if (cptr == nullptr)
	{
		return false;
	}
	else
	{
		*(FSoundID *)addr = FSoundID(cptr);
		return true;
	}
}